

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O0

void __thiscall Pl_StdioFile::finish(Pl_StdioFile *this)

{
  int iVar1;
  pointer pMVar2;
  int *piVar3;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Pl_StdioFile *local_10;
  Pl_StdioFile *this_local;
  
  local_10 = this;
  pMVar2 = std::unique_ptr<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>::
           operator->(&this->m);
  iVar1 = fflush((FILE *)pMVar2->file);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 9) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_30,&(this->super_Pipeline).identifier,
                     ": Pl_StdioFile::finish: stream already closed");
      std::logic_error::logic_error(this_00,(string *)&local_30);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  return;
}

Assistant:

void
Pl_StdioFile::finish()
{
    if ((fflush(m->file) == -1) && (errno == EBADF)) {
        throw std::logic_error(this->identifier + ": Pl_StdioFile::finish: stream already closed");
    }
}